

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O2

void __thiscall
TTD::RuntimeContextInfo::AddWellKnownDebuggerScopePath
          (RuntimeContextInfo *this,RecyclableObject *parent,DebuggerScope *dbgScope,uint32 index)

{
  bool bVar1;
  TTAutoString *str;
  HeapAllocator *this_00;
  TTAutoString *this_01;
  undefined **local_68;
  TTAutoString *scpath;
  size_t local_58;
  char *local_50;
  DWORD local_48;
  RecyclableObject *local_40;
  RecyclableObject *parent_local;
  DebuggerScope *dbgScope_local;
  
  local_40 = parent;
  parent_local = (RecyclableObject *)dbgScope;
  bVar1 = JsUtil::
          BaseDictionary<Js::DebuggerScope_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(&this->m_coreDbgScopeToPathMap,(DebuggerScope **)&parent_local);
  if (!bVar1) {
    str = JsUtil::
          BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Item(&this->m_coreObjToPathMap,&local_40);
    local_68 = &UtilSupport::TTAutoString::typeinfo;
    scpath = (TTAutoString *)0x0;
    local_58 = 0xffffffffffffffff;
    local_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTRuntimeInfoTracker.cpp"
    ;
    local_48 = 0x3b8;
    this_00 = Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)&stack0xffffffffffffff98
                        );
    this_01 = (TTAutoString *)Memory::HeapAllocator::AllocT<true>(this_00,0x18);
    UtilSupport::TTAutoString::TTAutoString(this_01,str);
    local_68 = (undefined **)this_01;
    UtilSupport::TTAutoString::Append(this_01,L".!scope[",0,0xffffffffffffffff);
    UtilSupport::TTAutoString::Append(this_01,(ulong)index);
    UtilSupport::TTAutoString::Append(this_01,L"]",0,0xffffffffffffffff);
    JsUtil::
    BaseDictionary<Js::DebuggerScope*,TTD::UtilSupport::TTAutoString*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::DebuggerScope*,TTD::UtilSupport::TTAutoString*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
              ((BaseDictionary<Js::DebuggerScope*,TTD::UtilSupport::TTAutoString*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)&this->m_coreDbgScopeToPathMap,(DebuggerScope **)&parent_local,
               (TTAutoString **)&stack0xffffffffffffff98);
  }
  return;
}

Assistant:

void RuntimeContextInfo::AddWellKnownDebuggerScopePath(Js::RecyclableObject* parent, Js::DebuggerScope* dbgScope, uint32 index)
    {
        if(!this->m_coreDbgScopeToPathMap.ContainsKey(dbgScope))
        {
            const UtilSupport::TTAutoString* ppath = this->m_coreObjToPathMap.Item(parent);

            UtilSupport::TTAutoString* scpath = TT_HEAP_NEW(UtilSupport::TTAutoString, *ppath);

            scpath->Append(_u(".!scope["));
            scpath->Append(index);
            scpath->Append(_u("]"));

            this->m_coreDbgScopeToPathMap.AddNew(dbgScope, scpath);
        }
    }